

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_Brep::Read(ON_Brep *this,ON_BinaryArchive *file)

{
  double *pdVar1;
  int iVar2;
  ON_BrepEdge *pOVar3;
  ON_BrepTrim *pOVar4;
  ON_BrepLoop *pOVar5;
  ON_BrepFace *pOVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ON_Interval domain;
  ON_Interval domain_00;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ON_Mesh *pOVar24;
  undefined7 extraout_var_02;
  ON_BrepRegionTopology *pOVar25;
  ulong uVar26;
  ON_BoundingBox *pOVar27;
  long lVar28;
  ON_BoundingBox *a;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ON_CurveProxy *pOVar33;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ON_Interval OVar36;
  ON_Interval real_curve_subdomain;
  int minor_version;
  double local_1d0;
  ON_BoundingBox *local_1c8;
  int local_1bc;
  double local_1b8;
  double local_1b0;
  int local_1a8;
  int local_1a4;
  ON_Brep *local_1a0;
  ON_Object *obj;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  bool bReadRegionTopology;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  int major_version;
  uchar b;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  ON_BoundingBox new_brep_bbox;
  ON_BoundingBox archive_brep_bbox;
  undefined4 uVar34;
  undefined4 uVar35;
  
  major_version = 0;
  minor_version = 0;
  bVar19 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  uVar30 = CONCAT71(extraout_var,bVar19) & 0xffffffff;
  if ((major_version == 2 & (byte)uVar30) == 1) {
    bVar19 = ReadOld200(this,file,minor_version);
    uVar30 = CONCAT71(extraout_var_00,bVar19) & 0xffffffff;
    goto LAB_0042e180;
  }
  if ((major_version == 3 & (byte)uVar30) != 1) goto LAB_0042e180;
  bVar19 = ON_CurveArray::Read(&this->m_C2,file);
  if (bVar19) {
    iVar23 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
    bVar19 = ON_CurveArray::Read(&this->m_C3,file);
    if (!bVar19) goto LAB_0042de8b;
    iVar29 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
    bVar19 = ON_SurfaceArray::Read(&this->m_S,file);
    if (!bVar19) goto LAB_0042de8b;
    iVar2 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
    bVar19 = ON_BrepVertexArray::Read(&this->m_V,file);
    if ((!bVar19) || (bVar19 = ON_BrepEdgeArray::Read(&this->m_E,file), !bVar19)) goto LAB_0042de8b;
    lVar28 = 0;
    local_1bc = iVar23;
    local_1a8 = iVar2;
    local_1a4 = iVar29;
    local_1a0 = this;
    for (lVar31 = 0;
        lVar31 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_count; lVar31 = lVar31 + 1) {
      pOVar3 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      *(ON_Brep **)((long)pOVar3->m_vi + lVar28 + 0x2c) = this;
      iVar23 = *(int *)((long)pOVar3->m_vi + lVar28 + -4);
      if ((-1 < iVar23) && (iVar23 < iVar29)) {
        pOVar33 = (ON_CurveProxy *)
                  ((long)&(((ON_CurveProxy *)
                           (&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))->
                          super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar28
                  );
        bVar19 = ON_CurveProxy::ProxyCurveIsReversed(pOVar33);
        OVar36 = ON_CurveProxy::ProxyCurveDomain(pOVar33);
        uVar34 = OVar36.m_t[1]._0_4_;
        uVar35 = OVar36.m_t[1]._4_4_;
        local_1b0 = OVar36.m_t[0];
        local_1b8 = OVar36.m_t[1];
        (*(pOVar33->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                  (pOVar33);
        local_1d0 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        local_1c8 = (ON_BoundingBox *)CONCAT44(uVar35,uVar34);
        OVar36.m_t[1] = local_1b8;
        OVar36.m_t[0] = local_1b0;
        ON_CurveProxy::SetProxyCurve
                  (pOVar33,(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a
                           [*(int *)&pOVar33[1].m_real_curve],OVar36);
        if (bVar19) {
          ON_CurveProxy::Reverse(pOVar33);
        }
        domain.m_t[1] = (double)local_1c8;
        domain.m_t[0] = local_1d0;
        ON_CurveProxy::SetDomain(pOVar33,domain);
        this = local_1a0;
        iVar29 = local_1a4;
      }
      lVar28 = lVar28 + 0x88;
    }
    bVar19 = ON_BrepTrimArray::Read(&this->m_T,file);
    if (!bVar19) goto LAB_0042de8b;
    lVar28 = 0;
    iVar23 = local_1bc;
    for (lVar31 = 0;
        lVar31 < (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                 m_count; lVar31 = lVar31 + 1) {
      pOVar4 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      *(ON_Brep **)((long)pOVar4->m_tolerance + lVar28 + 0x70) = this;
      iVar29 = *(int *)((long)pOVar4->m_vi + lVar28 + -8);
      if ((-1 < iVar29) && (iVar29 < iVar23)) {
        pOVar33 = (ON_CurveProxy *)
                  ((long)&(((ON_CurveProxy *)
                           (&(pOVar4->super_ON_CurveProxy).m_real_curve_domain + -2))->
                          super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar28
                  );
        bVar19 = ON_CurveProxy::ProxyCurveIsReversed(pOVar33);
        OVar36 = ON_CurveProxy::ProxyCurveDomain(pOVar33);
        uVar34 = OVar36.m_t[1]._0_4_;
        uVar35 = OVar36.m_t[1]._4_4_;
        local_1b0 = OVar36.m_t[0];
        local_1b8 = OVar36.m_t[1];
        (*(pOVar33->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                  (pOVar33);
        local_1d0 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        local_1c8 = (ON_BoundingBox *)CONCAT44(uVar35,uVar34);
        real_curve_subdomain.m_t[1] = local_1b8;
        real_curve_subdomain.m_t[0] = local_1b0;
        ON_CurveProxy::SetProxyCurve
                  (pOVar33,(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a
                           [*(int *)&pOVar33[1].m_real_curve],real_curve_subdomain);
        if (bVar19) {
          ON_CurveProxy::Reverse(pOVar33);
        }
        domain_00.m_t[1] = (double)local_1c8;
        domain_00.m_t[0] = local_1d0;
        ON_CurveProxy::SetDomain(pOVar33,domain_00);
        this = local_1a0;
        iVar23 = local_1bc;
      }
      lVar28 = lVar28 + 0xe8;
    }
    bVar19 = ON_BrepLoopArray::Read(&this->m_L,file);
    uVar30 = 0;
    if (bVar19) {
      uVar22 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
               m_count;
      pOVar5 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      uVar26 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar26 = uVar30;
      }
      for (; uVar26 * 0x78 - uVar30 != 0; uVar30 = uVar30 + 0x78) {
        *(ON_Brep **)((long)&pOVar5->m_brep + uVar30) = this;
      }
      bVar19 = ON_BrepFaceArray::Read(&this->m_F,file);
      if (bVar19) {
        lVar28 = 0;
        for (lVar31 = 0;
            lVar31 < (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                     m_count; lVar31 = lVar31 + 1) {
          pOVar6 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_a;
          *(ON_Brep **)((long)(&pOVar6->m_face_uuid + 7) + lVar28 + 0xc) = this;
          iVar23 = *(int *)((pOVar6->m_face_uuid).Data4 + lVar28 + -0x14);
          if ((-1 < (long)iVar23) && (iVar23 < local_1a8)) {
            ON_SurfaceProxy::SetProxySurface
                      ((ON_SurfaceProxy *)((pOVar6->m_face_uuid).Data4 + lVar28 + -0x5c),
                       (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar23]);
          }
          lVar28 = lVar28 + 0xd8;
        }
        bVar19 = ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_min);
        if (bVar19) {
          bVar19 = ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_max);
          uVar30 = CONCAT71(extraout_var_01,bVar19) & 0xffffffff;
          goto LAB_0042de8e;
        }
      }
      goto LAB_0042de8b;
    }
  }
  else {
LAB_0042de8b:
    uVar30 = 0;
  }
LAB_0042de8e:
  ReadFillInMissingBoxes(this);
  if ((0 < minor_version & (byte)uVar30) == 1) {
    lVar28 = (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_count;
    new_brep_bbox.m_min.x = (double)((ulong)new_brep_bbox.m_min.x & 0xffffffff00000000);
    _bReadRegionTopology = 0.0;
    bVar19 = ON_BinaryArchive::BeginRead3dmBigChunk
                       (file,(uint *)&new_brep_bbox,(ON__INT64 *)&bReadRegionTopology);
    if (bVar19) {
      bVar19 = false;
      if (new_brep_bbox.m_min.x._0_4_ == 0x40008000) {
        bVar19 = true;
        lVar32 = 0;
        for (lVar31 = 0; (bVar19 != false && (lVar31 < lVar28)); lVar31 = lVar31 + 1) {
          bVar19 = ON_BinaryArchive::ReadChar(file,&b);
          if ((bVar19) && (b != '\0')) {
            obj = (ON_Object *)0x0;
            iVar23 = ON_BinaryArchive::ReadObject(file,&obj);
            bVar19 = iVar23 != 0;
            if (obj != (ON_Object *)0x0) {
              pOVar24 = ON_Mesh::Cast(obj);
              if (pOVar24 == (ON_Mesh *)0x0) {
                if (obj != (ON_Object *)0x0) {
                  (*obj->_vptr_ON_Object[4])();
                }
              }
              else {
                ON_BrepFace::SetMesh
                          ((ON_BrepFace *)
                           ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                              super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                           lVar32 + -0x5c),render_mesh,pOVar24);
              }
            }
          }
          lVar32 = lVar32 + 0xd8;
        }
      }
      bVar20 = ON_BinaryArchive::EndRead3dmChunk(file);
      uVar30 = 0;
      if (bVar20) {
        uVar30 = (ulong)bVar19;
      }
      if ((char)uVar30 != '\0') {
        new_brep_bbox.m_min.x = (double)((ulong)new_brep_bbox.m_min.x & 0xffffffff00000000);
        _bReadRegionTopology = 0.0;
        bVar19 = ON_BinaryArchive::BeginRead3dmBigChunk
                           (file,(uint *)&new_brep_bbox,(ON__INT64 *)&bReadRegionTopology);
        if (!bVar19) goto LAB_0042e086;
        bVar19 = false;
        if (new_brep_bbox.m_min.x._0_4_ == 0x40008000) {
          bVar19 = true;
          lVar32 = 0;
          for (lVar31 = 0; (bVar19 != false && (lVar31 < lVar28)); lVar31 = lVar31 + 1) {
            bVar19 = ON_BinaryArchive::ReadChar(file,&b);
            if ((bVar19) && (b != '\0')) {
              iVar23 = ON_BinaryArchive::ReadObject(file,&obj);
              bVar19 = iVar23 != 0;
              if (obj != (ON_Object *)0x0) {
                pOVar24 = ON_Mesh::Cast(obj);
                if (pOVar24 == (ON_Mesh *)0x0) {
                  if (obj != (ON_Object *)0x0) {
                    (*obj->_vptr_ON_Object[4])();
                  }
                }
                else {
                  ON_BrepFace::SetMesh
                            ((ON_BrepFace *)
                             ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                             lVar32 + -0x5c),analysis_mesh,pOVar24);
                }
              }
            }
            lVar32 = lVar32 + 0xd8;
          }
        }
        bVar20 = ON_BinaryArchive::EndRead3dmChunk(file);
        uVar30 = 0;
        if (bVar20) {
          uVar30 = (ulong)bVar19;
        }
      }
    }
    else {
LAB_0042e086:
      uVar30 = 0;
    }
  }
  if (((uVar30 & 1) == 0) || (minor_version < 2)) goto LAB_0042e180;
  bVar19 = ON_BinaryArchive::ReadInt(file,&this->m_is_solid);
  uVar30 = CONCAT71(extraout_var_02,bVar19) & 0xffffffff;
  if (2 < (uint)this->m_is_solid) {
    this->m_is_solid = 0;
  }
  if (((char)uVar30 == '\0') || (minor_version < 3)) goto LAB_0042e180;
  obj = (ON_Object *)((ulong)obj & 0xffffffff00000000);
  bVar20 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(file,(int *)&obj);
  if (!bVar20) {
    uVar30 = 0;
    goto LAB_0042e180;
  }
  if ((int)obj < 1) {
    bVar20 = true;
  }
  else {
    _bReadRegionTopology = (double)((ulong)_bReadRegionTopology & 0xffffffffffffff00);
    bVar21 = ON_BinaryArchive::ReadBool(file,&bReadRegionTopology);
    bVar20 = true;
    if (bVar21) {
      if (bReadRegionTopology == true) {
        pOVar25 = (ON_BrepRegionTopology *)operator_new(0x38);
        ON_BrepRegionTopology::ON_BrepRegionTopology(pOVar25);
        this->m_region_topology = pOVar25;
        bVar21 = ON_BrepRegionTopology::Read(pOVar25,file);
        if (!bVar21) {
          pOVar25 = this->m_region_topology;
          if (pOVar25 != (ON_BrepRegionTopology *)0x0) {
            ON_BrepRegionTopology::~ON_BrepRegionTopology(pOVar25);
          }
          operator_delete(pOVar25,0x38);
          this->m_region_topology = (ON_BrepRegionTopology *)0x0;
          goto LAB_0042e166;
        }
      }
      bVar20 = false;
    }
  }
LAB_0042e166:
  bVar21 = ON_BinaryArchive::EndRead3dmChunk(file);
  uVar30 = (ulong)bVar19;
  if (!bVar21) {
    uVar30 = 0;
  }
  if (bVar20) {
    uVar30 = 0;
  }
LAB_0042e180:
  uVar22 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
  if (uVar22 < 0x1317f0a) {
    this->m_is_solid = 0;
  }
  iVar23 = ON_BinaryArchive::Archive3dmVersion(file);
  local_1d0 = (double)uVar30;
  if (iVar23 < 0x5a) {
    pOVar27 = &this->m_bbox;
    bVar19 = ON_BoundingBox::IsNotEmpty(pOVar27);
    if (bVar19) {
      dVar7 = (pOVar27->m_min).x;
      dVar8 = (this->m_bbox).m_min.y;
      dVar9 = (this->m_bbox).m_min.z;
      dVar10 = (this->m_bbox).m_max.x;
      dVar11 = (this->m_bbox).m_max.y;
      dVar12 = (this->m_bbox).m_max.z;
      new_brep_bbox.m_max.y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
      new_brep_bbox.m_max.z = ON_BoundingBox::EmptyBoundingBox.m_max.z;
      new_brep_bbox.m_min.z = ON_BoundingBox::EmptyBoundingBox.m_min.z;
      new_brep_bbox.m_max.x = ON_BoundingBox::EmptyBoundingBox.m_max.x;
      new_brep_bbox.m_min.x = ON_BoundingBox::EmptyBoundingBox.m_min.x;
      new_brep_bbox.m_min.y = ON_BoundingBox::EmptyBoundingBox.m_min.y;
      uVar22 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
               m_count;
      local_1c8 = pOVar27;
      for (lVar28 = 0; (ulong)uVar22 * 0xd8 - lVar28 != 0; lVar28 = lVar28 + 0xd8) {
        pOVar6 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
        pdVar1 = (double *)
                 ((long)&(((ON_BoundingBox *)((ON_Color *)(&pOVar6->m_face_uuid + 1) + 1))->m_min).x
                 + lVar28);
        dVar13 = *pdVar1;
        dVar14 = pdVar1[1];
        dVar15 = *(double *)((long)(&pOVar6->m_face_uuid + 2) + lVar28 + 4);
        dVar16 = ((double *)((long)(&pOVar6->m_face_uuid + 2) + lVar28 + 4))[1];
        dVar17 = *(double *)((long)(&pOVar6->m_face_uuid + 3) + lVar28 + 4);
        dVar18 = ((double *)((long)(&pOVar6->m_face_uuid + 3) + lVar28 + 4))[1];
        ON_BrepFace::InternalFaceBoundingBox
                  ((ON_BoundingBox *)&b,
                   (ON_BrepFace *)((pOVar6->m_face_uuid).Data4 + lVar28 + -0x5c),false,false);
        local_178 = local_108;
        dStack_170 = dStack_100;
        local_188 = local_118;
        dStack_180 = dStack_110;
        obj = _b;
        dStack_190 = dStack_120;
        _bReadRegionTopology = dVar13;
        dStack_160 = dVar14;
        local_158 = dVar15;
        dStack_150 = dVar16;
        local_148 = dVar17;
        dStack_140 = dVar18;
        bVar19 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)&obj);
        pOVar27 = (ON_BoundingBox *)&bReadRegionTopology;
        if ((bVar19) &&
           (bVar19 = ON_BoundingBox::IsValid((ON_BoundingBox *)&bReadRegionTopology),
           pOVar27 = (ON_BoundingBox *)&obj, bVar19)) {
          ON_BoundingBox::Includes
                    ((ON_BoundingBox *)&bReadRegionTopology,(ON_BoundingBox *)&obj,false);
        }
        a = (ON_BoundingBox *)
            ((long)&(((ON_BoundingBox *)((ON_Color *)(&pOVar6->m_face_uuid + 1) + 1))->m_min).x +
            lVar28);
        dVar13 = (pOVar27->m_min).x;
        dVar14 = (pOVar27->m_min).y;
        dVar15 = (pOVar27->m_min).z;
        dVar16 = (pOVar27->m_max).x;
        dVar17 = (pOVar27->m_max).z;
        *(double *)((long)(&pOVar6->m_face_uuid + 3) + lVar28 + 4) = (pOVar27->m_max).y;
        *(double *)((long)(&pOVar6->m_face_uuid + 3) + lVar28 + 0xc) = dVar17;
        *(double *)((long)(&pOVar6->m_face_uuid + 2) + lVar28 + 4) = dVar15;
        *(double *)((long)(&pOVar6->m_face_uuid + 2) + lVar28 + 0xc) = dVar16;
        (a->m_min).x = dVar13;
        *(double *)((long)((ON_Color *)(&pOVar6->m_face_uuid + 1) + 3) + lVar28) = dVar14;
        ON_BoundingBox::Union(&new_brep_bbox,a);
      }
      pOVar27 = (ON_BoundingBox *)&obj;
      local_178 = new_brep_bbox.m_max.y;
      dStack_170 = new_brep_bbox.m_max.z;
      local_188 = new_brep_bbox.m_min.z;
      dStack_180 = new_brep_bbox.m_max.x;
      obj = (ON_Object *)new_brep_bbox.m_min.x;
      dStack_190 = new_brep_bbox.m_min.y;
      _bReadRegionTopology = dVar7;
      dStack_160 = dVar8;
      local_158 = dVar9;
      dStack_150 = dVar10;
      local_148 = dVar11;
      dStack_140 = dVar12;
      bVar19 = ON_BoundingBox::IsNotEmpty(pOVar27);
      if (bVar19) {
        bVar19 = ON_BoundingBox::IsValid((ON_BoundingBox *)&bReadRegionTopology);
        dVar7 = local_1d0;
        local_1d0 = dVar7;
        if (bVar19) {
          pOVar27 = (ON_BoundingBox *)&obj;
          ON_BoundingBox::Includes((ON_BoundingBox *)&bReadRegionTopology,pOVar27,false);
          local_1d0 = dVar7;
        }
      }
      else {
        pOVar27 = (ON_BoundingBox *)&bReadRegionTopology;
      }
      dVar7 = (pOVar27->m_min).x;
      dVar8 = (pOVar27->m_min).y;
      dVar9 = (pOVar27->m_min).z;
      dVar10 = (pOVar27->m_max).x;
      dVar11 = (pOVar27->m_max).z;
      (local_1c8->m_max).y = (pOVar27->m_max).y;
      (local_1c8->m_max).z = dVar11;
      (local_1c8->m_min).z = dVar9;
      (local_1c8->m_max).x = dVar10;
      (local_1c8->m_min).x = dVar7;
      (local_1c8->m_min).y = dVar8;
    }
  }
  return (bool)(SUB81(local_1d0,0) & 1);
}

Assistant:

bool ON_Brep::Read( ON_BinaryArchive& file )
{
  int i;
  int C2_count = 0;
  int C3_count = 0;
  int S_count = 0;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion( &major_version, &minor_version );
  if ( rc && major_version == 2 ) 
  {
    rc = ReadOld200(file,minor_version); // legacy trimmed face
  }
  else if ( rc && major_version == 3 ) 
  {
    // 2d curves
    if (rc) 
      rc = m_C2.Read(file);
    C2_count = m_C2.Count();

    // 3d curves
    if (rc) 
      rc = m_C3.Read(file);
    C3_count = m_C3.Count();

    // untrimmed surfaces
    if (rc) 
      rc = m_S.Read(file);
    S_count = m_S.Count();

    // vertices
    if (rc) 
      rc = m_V.Read(file);

    // edges
    if (rc) 
    {
      rc = m_E.Read(file);
      if (rc) {
        for ( i = 0; i < m_E.Count(); i++ ) {
          ON_BrepEdge& e = m_E[i];
          e.m_brep = this;
          if ( e.m_c3i >= 0 && e.m_c3i < C3_count )
          {
            bool bProxyCurveIsReversed = e.ProxyCurveIsReversed();
            ON_Interval pdom = e.ProxyCurveDomain();
            ON_Interval edom = e.Domain();
            e.SetProxyCurve( m_C3[e.m_c3i], pdom );
            if ( bProxyCurveIsReversed )
              e.ON_CurveProxy::Reverse();
            e.SetDomain(edom);
          }
        }
      }
    }

    // trims
    if (rc) 
    {
      rc = m_T.Read(file);
      if (rc) {
        for ( i = 0; i < m_T.Count(); i++ ) {
          ON_BrepTrim& trim = m_T[i];
          trim.m_brep = this;
          if ( trim.m_c2i >= 0 && trim.m_c2i < C2_count )
          {
            bool bProxyCurveIsReversed = trim.ProxyCurveIsReversed();
            ON_Interval pdom = trim.ProxyCurveDomain();
            ON_Interval tdom = trim.Domain();
            trim.SetProxyCurve( m_C2[trim.m_c2i], pdom );
            if ( bProxyCurveIsReversed )
              trim.ON_CurveProxy::Reverse();
            trim.SetDomain(tdom);
          }
        }
      }
    }

    // loops
    if (rc) 
    {
      rc = m_L.Read(file);
      if ( rc )
      {
        for ( i = 0; i < m_L.Count(); i++ ) 
        {
          m_L[i].m_brep = this;
        }
      }
    }

    // faces
    if (rc) 
    {
      rc = m_F.Read(file);
      if (rc) {
        for ( i = 0; i < m_F.Count(); i++ ) {
          ON_BrepFace& f = m_F[i];
          f.m_brep = this;
          if ( f.m_si >= 0 && f.m_si < S_count )
            f.SetProxySurface(m_S[f.m_si]);
        }
      }
    }

    // bounding box
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_min );
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_max );

    // fill in missing information
    ReadFillInMissingBoxes(*this);

    // end of chunk version 3.0

    if (rc && minor_version >= 1 )
    {
      // added for chunk version 3.1

      ON_Object* obj;
      ON__UINT32 tcode = 0;
      ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
      int fi;
      unsigned char b;

      const int face_count = m_F.Count();

      // read render meshes
      tcode = 0;
      length_TCODE_ANONYMOUS_CHUNK = 0;
      rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
      if ( rc )
      {
        if ( tcode != TCODE_ANONYMOUS_CHUNK )
          rc = false;
        else
        {
          for ( fi = 0; rc && fi < face_count; fi++ ) 
          {
            rc = file.ReadChar(&b);
            if (rc && b) 
            {
              obj = 0;
              rc = file.ReadObject(&obj);
              if ( 0 != obj )
              {
                auto pMesh = ON_Mesh::Cast(obj);
                if (nullptr == pMesh)
                {
                  delete obj;
                }
                else
                {
                  m_F[fi].SetMesh(ON::render_mesh, pMesh);
                }
              }
            }
          }
        }
        if ( !file.EndRead3dmChunk() )
          rc = false;
      }

      if (rc)
      {
        // read analysis meshes
        tcode = 0;
        length_TCODE_ANONYMOUS_CHUNK = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
        if ( rc )
        {
          if ( tcode != TCODE_ANONYMOUS_CHUNK )
            rc = false;
          else
          {
            for ( fi = 0; rc && fi < face_count; fi++ ) 
            {
              rc = file.ReadChar(&b);
              if (rc && b) 
              {
                rc = file.ReadObject(&obj);
                
                if (nullptr != obj)
                {
                  auto pMesh = ON_Mesh::Cast(obj);
                  if (nullptr == pMesh)
                  {
                    delete obj;
                  }
                  else
                  {
                    m_F[fi].SetMesh(ON::analysis_mesh, pMesh);
                  }
                }
              }
            }
          }
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if ( rc && minor_version >= 2 )
    {
      rc =  file.ReadInt( &m_is_solid );
      if ( m_is_solid < 0 || m_is_solid >= 3 )
        m_is_solid = 0;
      if (rc && minor_version >= 3)
      {
        // begin chunk verson 3.3

        // region topology chunk added
        int region_topology_chunk_version = 0;
        if (!file.BeginRead3dmAnonymousChunk(&region_topology_chunk_version))
          rc = false;
        else
        {
          bool rc1 = false;
          for (;;)
          {
            if (region_topology_chunk_version < 1)
              break;

            bool bReadRegionTopology = false;
            if (!file.ReadBool(&bReadRegionTopology))
              break;

            if (bReadRegionTopology)
            {
              m_region_topology = new ON_BrepRegionTopology();
              if (!m_region_topology->Read(file))
              {
                delete m_region_topology;
                m_region_topology = nullptr;
                break;
              }
            }
            rc1 = true;
            break;
          }
          if (!file.EndRead3dmChunk())
            rc1 = false;
          if (false == rc1)
            rc = false;
        }
      }
    }
  }

  if ( file.ArchiveOpenNURBSVersion() < 20021002 )
  {
    m_is_solid = 0;
  }

  // GBA 3-Sept-20 RH-60112
  // In V6 and earlier bounding boxes of faces were bounding box of underlying surface.
  // This can result in enourmous boxes which mess up make2d
  // In V7 bounding boxes use the trim pbox resulting in resonable boxes.
  ////if (file.Archive3dmVersion() < 70 || file.ArchiveOpenNURBSVersion() < 2382395020)
  ////{
  ////  if (!m_bbox.IsEmpty())
  ////  {
  ////    ON_BoundingBox orig_box = m_bbox;
  ////    ClearBoundingBox();
  ////    BoundingBox();                    // compute bounding box
  ////    m_bbox.Intersection(orig_box);
  ////  }
  ////}

  // Dale Lear https://mcneel.myjetbrains.com/youtrack/issue/RH-64277
  // The test used to fix RH-60112 was not adequate and now the set of
  // active v7 3dm files has lots of cases with breps that have
  // oversized bounding boxes by the new standard avter Greg's RH-60112 changes.
  // We have already started writing V8 files and those versions of V8
  // have been used by some of our Discourse early adopters.
  // At this point, I'm going to assume a bounding box read from a V7 or V8 file
  // can be too big. By the time V9 rolls around, the boxes should be cleaned up.
  if (file.Archive3dmVersion() < 90 && m_bbox.IsNotEmpty() )
  {
    const ON_BoundingBox archive_brep_bbox = m_bbox;
    ON_BoundingBox new_brep_bbox = ON_BoundingBox::EmptyBoundingBox;
    const unsigned int face_count = m_F.UnsignedCount();
    for (unsigned fi = 0; fi < face_count; ++fi)
    {
      ON_BrepFace& f = this->m_F[fi];
      const ON_BoundingBox archive_face_bbox = f.m_bbox;
      ON_BoundingBox new_face_bbox = f.InternalFaceBoundingBox(false, false);
      f.m_bbox = Internal_BestBoundingBox(archive_face_bbox, new_face_bbox);
      new_brep_bbox.Union(f.m_bbox);
    }
    m_bbox = Internal_BestBoundingBox(archive_brep_bbox, new_brep_bbox);
  }

  return rc;
}